

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O2

UBool __thiscall
icu_63::CollationElementIterator::operator==
          (CollationElementIterator *this,CollationElementIterator *that)

{
  UBool UVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  
  if (this == that) {
    return '\x01';
  }
  if ((this->rbc_ == that->rbc_) ||
     (iVar2 = (*(this->rbc_->super_Collator).super_UObject._vptr_UObject[3])(), (char)iVar2 != '\0')
     ) {
    if (this->otherHalf_ != that->otherHalf_) {
      return '\0';
    }
    cVar3 = (char)*(undefined4 *)&this->dir_;
    if (cVar3 == '\x01') {
      cVar3 = '\0';
    }
    cVar4 = (char)*(undefined4 *)&that->dir_;
    if (cVar4 == '\x01') {
      cVar4 = '\0';
    }
    if (cVar3 != cVar4) {
      return '\0';
    }
    UVar1 = UnicodeString::operator==(&this->string_,&that->string_);
    if (UVar1 != '\0') {
      iVar2 = (*(this->iter_->super_UObject)._vptr_UObject[3])(this->iter_,that->iter_);
      return (char)iVar2 != '\0';
    }
  }
  return '\0';
}

Assistant:

UBool CollationElementIterator::operator==(
                                    const CollationElementIterator& that) const
{
    if (this == &that) {
        return TRUE;
    }

    return
        (rbc_ == that.rbc_ || *rbc_ == *that.rbc_) &&
        otherHalf_ == that.otherHalf_ &&
        normalizeDir() == that.normalizeDir() &&
        string_ == that.string_ &&
        *iter_ == *that.iter_;
}